

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode wc_statemach(connectdata *conn)

{
  void **ppvVar1;
  SessionHandle *pSVar2;
  curl_chunk_end_callback p_Var3;
  curl_llist *pcVar4;
  SessionHandle *pSVar5;
  curl_chunk_bgn_callback p_Var6;
  bool bVar7;
  CURLcode CVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  undefined8 *puVar12;
  ftp_parselist_data *pfVar13;
  
  do {
    pSVar2 = conn->data;
    switch((pSVar2->wildcard).state) {
    case CURLWC_INIT:
      pcVar9 = (pSVar2->state).path;
      pcVar11 = strrchr(pcVar9,0x2f);
      if (pcVar11 == (char *)0x0) {
        if (*pcVar9 == '\0') goto LAB_0058e46a;
        pcVar11 = (*Curl_cstrdup)(pcVar9);
        (pSVar2->wildcard).pattern = pcVar11;
      }
      else {
        if (pcVar11[1] == '\0') {
LAB_0058e46a:
          (pSVar2->wildcard).state = CURLWC_CLEAN;
          CVar8 = ftp_parse_url_path(conn);
          goto LAB_0058e4de;
        }
        pcVar9 = pcVar11 + 1;
        pcVar11 = (*Curl_cstrdup)(pcVar9);
        (pSVar2->wildcard).pattern = pcVar11;
      }
      if (pcVar11 != (char *)0x0) {
        *pcVar9 = '\0';
        puVar12 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
        if (puVar12 == (undefined8 *)0x0) {
          (*Curl_cfree)((pSVar2->wildcard).pattern);
          (pSVar2->wildcard).pattern = (char *)0x0;
        }
        else {
          pfVar13 = Curl_ftp_parselist_data_alloc();
          *puVar12 = pfVar13;
          if (pfVar13 == (ftp_parselist_data *)0x0) {
            (*Curl_cfree)((pSVar2->wildcard).pattern);
            (pSVar2->wildcard).pattern = (char *)0x0;
            (*Curl_cfree)(puVar12);
          }
          else {
            (pSVar2->wildcard).tmp = puVar12;
            (pSVar2->wildcard).tmp_dtor = wc_data_dtor;
            if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
              (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
            }
            ppvVar1 = &(pSVar2->wildcard).tmp;
            CVar8 = ftp_parse_url_path(conn);
            if (CVar8 != CURLE_OK) {
              (*Curl_cfree)((pSVar2->wildcard).pattern);
              (pSVar2->wildcard).pattern = (char *)0x0;
              (*(pSVar2->wildcard).tmp_dtor)((pSVar2->wildcard).tmp);
              *ppvVar1 = (void *)0x0;
              (pSVar2->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
              goto LAB_0058e4de;
            }
            pcVar9 = (*Curl_cstrdup)((conn->data->state).path);
            (pSVar2->wildcard).path = pcVar9;
            if (pcVar9 != (char *)0x0) {
              pSVar5 = conn->data;
              puVar12[1] = (pSVar5->set).fwrite_func;
              (pSVar5->set).fwrite_func = Curl_ftp_parselist;
              puVar12[2] = (pSVar5->set).out;
              (pSVar5->set).out = conn;
              CVar8 = CURLE_OK;
              Curl_infof(pSVar5,"Wildcard - Parsing started\n");
              goto LAB_0058e4de;
            }
            (*Curl_cfree)((pSVar2->wildcard).pattern);
            (pSVar2->wildcard).pattern = (char *)0x0;
            (*(pSVar2->wildcard).tmp_dtor)((pSVar2->wildcard).tmp);
            *ppvVar1 = (void *)0x0;
            (pSVar2->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
          }
        }
      }
      CVar8 = CURLE_OUT_OF_MEMORY;
LAB_0058e4de:
      if ((pSVar2->wildcard).state == CURLWC_CLEAN) {
        return CVar8;
      }
      (pSVar2->wildcard).state = (uint)(CVar8 != CURLE_OK) * 4 + CURLWC_MATCHING;
      return CVar8;
    case CURLWC_MATCHING:
      puVar12 = (undefined8 *)(pSVar2->wildcard).tmp;
      (pSVar2->set).fwrite_func = (curl_write_callback)puVar12[1];
      (pSVar2->set).out = (void *)puVar12[2];
      puVar12[1] = 0;
      puVar12[2] = 0;
      (pSVar2->wildcard).state = CURLWC_DOWNLOADING;
      CVar8 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar12);
      if (CVar8 == CURLE_OK) {
        if (((pSVar2->wildcard).filelist)->size == 0) {
          (pSVar2->wildcard).state = CURLWC_CLEAN;
          return CURLE_REMOTE_FILE_NOT_FOUND;
        }
      }
      else {
        (pSVar2->wildcard).state = CURLWC_CLEAN;
      }
      break;
    case CURLWC_DOWNLOADING:
      puVar12 = (undefined8 *)((pSVar2->wildcard).filelist)->head->ptr;
      pcVar9 = curl_maprintf("%s%s",(pSVar2->wildcard).path,*puVar12);
      if (pcVar9 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (*Curl_cfree)((conn->data->state).pathbuffer);
      pSVar5 = conn->data;
      (pSVar5->state).pathbuffer = pcVar9;
      (pSVar5->state).path = pcVar9;
      Curl_infof(pSVar5,"Wildcard - START of \"%s\"\n",*puVar12);
      p_Var6 = (conn->data->set).chunk_bgn;
      if (p_Var6 != (curl_chunk_bgn_callback)0x0) {
        lVar10 = (*p_Var6)(puVar12,(pSVar2->wildcard).customptr,
                           (int)((pSVar2->wildcard).filelist)->size);
        if (lVar10 == 1) {
          pcVar9 = (char *)0x58;
          bVar7 = false;
        }
        else if (lVar10 == 2) {
          bVar7 = false;
          Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar12);
          (pSVar2->wildcard).state = CURLWC_SKIP;
          CVar8 = wc_statemach(conn);
          pcVar9 = (char *)(ulong)CVar8;
        }
        else {
          bVar7 = true;
        }
        if (!bVar7) {
          return (CURLcode)pcVar9;
        }
      }
      if (*(int *)(puVar12 + 1) == 0) {
        if ((*(byte *)(puVar12 + 0xc) & 0x40) != 0) {
          (conn->proto).ftpc.known_filesize = puVar12[5];
        }
        CVar8 = ftp_parse_url_path(conn);
        if (CVar8 != CURLE_OK) {
          return CVar8;
        }
        pcVar4 = (pSVar2->wildcard).filelist;
        Curl_llist_remove(pcVar4,pcVar4->head,(void *)0x0);
        if (((pSVar2->wildcard).filelist)->size != 0) {
          return CURLE_OK;
        }
        (pSVar2->wildcard).state = CURLWC_CLEAN;
        return CURLE_OK;
      }
      (pSVar2->wildcard).state = CURLWC_SKIP;
      break;
    case CURLWC_CLEAN:
      puVar12 = (undefined8 *)(pSVar2->wildcard).tmp;
      CVar8 = CURLE_OK;
      if (puVar12 != (undefined8 *)0x0) {
        CVar8 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar12);
      }
      (pSVar2->wildcard).state = (CVar8 == CURLE_OK) + CURLWC_ERROR;
      return CVar8;
    case CURLWC_SKIP:
      p_Var3 = (pSVar2->set).chunk_end;
      if (p_Var3 != (curl_chunk_end_callback)0x0) {
        (*p_Var3)((pSVar2->wildcard).customptr);
      }
      pcVar4 = (pSVar2->wildcard).filelist;
      Curl_llist_remove(pcVar4,pcVar4->head,(void *)0x0);
      (pSVar2->wildcard).state = (((pSVar2->wildcard).filelist)->size == 0) + CURLWC_DOWNLOADING;
      break;
    default:
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode wc_statemach(struct connectdata *conn)
{
  struct WildcardData * const wildcard = &(conn->data->wildcard);
  CURLcode result = CURLE_OK;

  switch (wildcard->state) {
  case CURLWC_INIT:
    result = init_wc_data(conn);
    if(wildcard->state == CURLWC_CLEAN)
      /* only listing! */
      break;
    else
      wildcard->state = result ? CURLWC_ERROR : CURLWC_MATCHING;
    break;

  case CURLWC_MATCHING: {
    /* In this state is LIST response successfully parsed, so lets restore
       previous WRITEFUNCTION callback and WRITEDATA pointer */
    struct ftp_wc_tmpdata *ftp_tmp = wildcard->tmp;
    conn->data->set.fwrite_func = ftp_tmp->backup.write_function;
    conn->data->set.out = ftp_tmp->backup.file_descriptor;
    ftp_tmp->backup.write_function = ZERO_NULL;
    ftp_tmp->backup.file_descriptor = NULL;
    wildcard->state = CURLWC_DOWNLOADING;

    if(Curl_ftp_parselist_geterror(ftp_tmp->parser)) {
      /* error found in LIST parsing */
      wildcard->state = CURLWC_CLEAN;
      return wc_statemach(conn);
    }
    else if(wildcard->filelist->size == 0) {
      /* no corresponding file */
      wildcard->state = CURLWC_CLEAN;
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    return wc_statemach(conn);
  }

  case CURLWC_DOWNLOADING: {
    /* filelist has at least one file, lets get first one */
    struct ftp_conn *ftpc = &conn->proto.ftpc;
    struct curl_fileinfo *finfo = wildcard->filelist->head->ptr;

    char *tmp_path = aprintf("%s%s", wildcard->path, finfo->filename);
    if(!tmp_path)
      return CURLE_OUT_OF_MEMORY;

    /* switch default "state.pathbuffer" and tmp_path, good to see
       ftp_parse_url_path function to understand this trick */
    Curl_safefree(conn->data->state.pathbuffer);
    conn->data->state.pathbuffer = tmp_path;
    conn->data->state.path = tmp_path;

    infof(conn->data, "Wildcard - START of \"%s\"\n", finfo->filename);
    if(conn->data->set.chunk_bgn) {
      long userresponse = conn->data->set.chunk_bgn(
          finfo, wildcard->customptr, (int)wildcard->filelist->size);
      switch(userresponse) {
      case CURL_CHUNK_BGN_FUNC_SKIP:
        infof(conn->data, "Wildcard - \"%s\" skipped by user\n",
              finfo->filename);
        wildcard->state = CURLWC_SKIP;
        return wc_statemach(conn);
      case CURL_CHUNK_BGN_FUNC_FAIL:
        return CURLE_CHUNK_FAILED;
      }
    }

    if(finfo->filetype != CURLFILETYPE_FILE) {
      wildcard->state = CURLWC_SKIP;
      return wc_statemach(conn);
    }

    if(finfo->flags & CURLFINFOFLAG_KNOWN_SIZE)
      ftpc->known_filesize = finfo->size;

    result = ftp_parse_url_path(conn);
    if(result)
      return result;

    /* we don't need the Curl_fileinfo of first file anymore */
    Curl_llist_remove(wildcard->filelist, wildcard->filelist->head, NULL);

    if(wildcard->filelist->size == 0) { /* remains only one file to down. */
      wildcard->state = CURLWC_CLEAN;
      /* after that will be ftp_do called once again and no transfer
         will be done because of CURLWC_CLEAN state */
      return CURLE_OK;
    }
  } break;

  case CURLWC_SKIP: {
    if(conn->data->set.chunk_end)
      conn->data->set.chunk_end(conn->data->wildcard.customptr);
    Curl_llist_remove(wildcard->filelist, wildcard->filelist->head, NULL);
    wildcard->state = (wildcard->filelist->size == 0) ?
                      CURLWC_CLEAN : CURLWC_DOWNLOADING;
    return wc_statemach(conn);
  }

  case CURLWC_CLEAN: {
    struct ftp_wc_tmpdata *ftp_tmp = wildcard->tmp;
    result = CURLE_OK;
    if(ftp_tmp)
      result = Curl_ftp_parselist_geterror(ftp_tmp->parser);

    wildcard->state = result ? CURLWC_ERROR : CURLWC_DONE;
  } break;

  case CURLWC_DONE:
  case CURLWC_ERROR:
    break;
  }

  return result;
}